

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBlendTests.cpp
# Opt level: O0

int __thiscall deqp::gles2::Functional::BlendCase::init(BlendCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  RenderTarget *pRVar2;
  PixelFormat *pPVar3;
  QuadRenderer *this_00;
  RenderContext *context;
  ReferenceQuadRenderer *this_01;
  TextureLevel *this_02;
  Vec4 *pVVar4;
  Vec4 *pVVar5;
  TextureFormat local_d0;
  Vector<int,_2> local_c8;
  Vector<int,_2> local_c0;
  Vector<int,_2> local_b8;
  Vector<int,_2> local_b0;
  Vector<float,_4> local_a8;
  Vector<float,_4> local_98;
  Vector<float,_4> local_88;
  Vector<float,_4> local_78;
  undefined8 local_68;
  undefined8 local_60;
  Vector<float,_4> local_58;
  Vector<float,_4> local_48;
  undefined8 local_38;
  undefined8 local_30;
  int local_28;
  int i;
  byte local_11;
  BlendCase *pBStack_10;
  bool useRGB;
  BlendCase *this_local;
  
  pBStack_10 = this;
  pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
  pPVar3 = tcu::RenderTarget::getPixelFormat(pRVar2);
  local_11 = pPVar3->alphaBits == 0;
  if (init()::baseGradientColors == '\0') {
    iVar1 = __cxa_guard_acquire(&init()::baseGradientColors);
    if (iVar1 != 0) {
      tcu::Vector<float,_4>::Vector(init::baseGradientColors,0.0,0.5,1.0,0.5);
      tcu::Vector<float,_4>::Vector(init::baseGradientColors + 1,0.5,0.0,0.5,1.0);
      tcu::Vector<float,_4>::Vector(init::baseGradientColors + 2,0.5,1.0,0.5,0.0);
      tcu::Vector<float,_4>::Vector(init::baseGradientColors + 3,1.0,0.5,0.0,0.5);
      __cxa_guard_release(&init()::baseGradientColors);
    }
  }
  for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
    tcu::operator-((tcu *)&local_58,init::baseGradientColors + local_28,0.5);
    tcu::operator*((tcu *)&local_48,&local_58,0.2);
    tcu::operator+((tcu *)&local_38,&local_48,0.5);
    pVVar4 = (this->m_firstQuad).color + local_28;
    *(undefined8 *)pVVar4->m_data = local_38;
    *(undefined8 *)(pVVar4->m_data + 2) = local_30;
    pVVar5 = (this->m_firstQuad).color + local_28;
    pVVar4 = (this->m_firstQuadInt).color + local_28;
    *(undefined8 *)pVVar4->m_data = *(undefined8 *)pVVar5->m_data;
    *(undefined8 *)(pVVar4->m_data + 2) = *(undefined8 *)(pVVar5->m_data + 2);
    tcu::Vector<float,_4>::Vector(&local_a8,1.0);
    tcu::operator-((tcu *)&local_98,&local_a8,init::baseGradientColors + local_28);
    tcu::operator-((tcu *)&local_88,&local_98,0.5);
    tcu::operator*((tcu *)&local_78,&local_88,1.0);
    tcu::operator+((tcu *)&local_68,&local_78,0.5);
    pVVar4 = (this->m_secondQuad).color + local_28;
    *(undefined8 *)pVVar4->m_data = local_68;
    *(undefined8 *)(pVVar4->m_data + 2) = local_60;
    pVVar5 = (this->m_secondQuad).color + local_28;
    pVVar4 = (this->m_secondQuadInt).color + local_28;
    *(undefined8 *)pVVar4->m_data = *(undefined8 *)pVVar5->m_data;
    *(undefined8 *)(pVVar4->m_data + 2) = *(undefined8 *)(pVVar5->m_data + 2);
  }
  pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = tcu::RenderTarget::getWidth(pRVar2);
  iVar1 = de::min<int>(iVar1,0x40);
  this->m_viewportW = iVar1;
  pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = tcu::RenderTarget::getHeight(pRVar2);
  iVar1 = de::min<int>(iVar1,0x40);
  this->m_viewportH = iVar1;
  tcu::Vector<int,_2>::Vector(&local_b0,0,0);
  *&(this->m_firstQuadInt).posA.m_data = local_b0.m_data;
  tcu::Vector<int,_2>::Vector(&local_b8,0,0);
  *&(this->m_secondQuadInt).posA.m_data = local_b8.m_data;
  tcu::Vector<int,_2>::Vector(&local_c0,this->m_viewportW + -1,this->m_viewportH + -1);
  *&(this->m_firstQuadInt).posB.m_data = local_c0.m_data;
  tcu::Vector<int,_2>::Vector(&local_c8,this->m_viewportW + -1,this->m_viewportH + -1);
  *&(this->m_secondQuadInt).posB.m_data = local_c8.m_data;
  this_00 = (QuadRenderer *)operator_new(0x20);
  context = Context::getRenderContext((this->super_TestCase).m_context);
  deqp::gls::FragmentOpUtil::QuadRenderer::QuadRenderer(this_00,context,GLSL_VERSION_100_ES);
  this->m_renderer = this_00;
  this_01 = (ReferenceQuadRenderer *)operator_new(0x11108);
  deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::ReferenceQuadRenderer(this_01);
  this->m_referenceRenderer = this_01;
  this_02 = (TextureLevel *)operator_new(0x28);
  tcu::TextureFormat::TextureFormat(&local_d0,RGBA - (local_11 & 1),UNORM_INT8);
  tcu::TextureLevel::TextureLevel(this_02,&local_d0,this->m_viewportW,this->m_viewportH,1);
  this->m_refColorBuffer = this_02;
  this->m_curParamSetNdx = 0;
  return (int)this;
}

Assistant:

void BlendCase::init (void)
{
	bool useRGB = m_context.getRenderTarget().getPixelFormat().alphaBits == 0;

	static const Vec4 baseGradientColors[4] =
	{
		Vec4(0.0f, 0.5f, 1.0f, 0.5f),
		Vec4(0.5f, 0.0f, 0.5f, 1.0f),
		Vec4(0.5f, 1.0f, 0.5f, 0.0f),
		Vec4(1.0f, 0.5f, 0.0f, 0.5f)
	};

	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(m_firstQuad.color) == DE_LENGTH_OF_ARRAY(m_firstQuadInt.color));
	for (int i = 0; i < DE_LENGTH_OF_ARRAY(m_firstQuad.color); i++)
	{
		m_firstQuad.color[i]		= (baseGradientColors[i] - 0.5f) * 0.2f + 0.5f;
		m_firstQuadInt.color[i]		= m_firstQuad.color[i];

		m_secondQuad.color[i]		= (Vec4(1.0f) - baseGradientColors[i] - 0.5f) * 1.0f + 0.5f;
		m_secondQuadInt.color[i]	= m_secondQuad.color[i];
	}

	m_viewportW = de::min<int>(m_context.getRenderTarget().getWidth(),	MAX_VIEWPORT_WIDTH);
	m_viewportH = de::min<int>(m_context.getRenderTarget().getHeight(),	MAX_VIEWPORT_HEIGHT);

	m_firstQuadInt.posA		= tcu::IVec2(0,					0);
	m_secondQuadInt.posA	= tcu::IVec2(0,					0);
	m_firstQuadInt.posB		= tcu::IVec2(m_viewportW-1,		m_viewportH-1);
	m_secondQuadInt.posB	= tcu::IVec2(m_viewportW-1,		m_viewportH-1);

	DE_ASSERT(!m_renderer);
	DE_ASSERT(!m_referenceRenderer);
	DE_ASSERT(!m_refColorBuffer);

	m_renderer				= new QuadRenderer(m_context.getRenderContext(), glu::GLSL_VERSION_100_ES);
	m_referenceRenderer		= new ReferenceQuadRenderer;
	m_refColorBuffer		= new TextureLevel(TextureFormat(useRGB ? TextureFormat::RGB : TextureFormat::RGBA, TextureFormat::UNORM_INT8),
											   m_viewportW, m_viewportH);

	m_curParamSetNdx = 0;
}